

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

bool cppwinrt::operator==(type_name *left,type_name *right)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  bool bVar1;
  
  __x._M_len = (left->name)._M_len;
  __x._M_str = (left->name)._M_str;
  __y._M_len = (right->name)._M_len;
  __y._M_str = (right->name)._M_str;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    __x_00._M_len = (left->name_space)._M_len;
    __x_00._M_str = (left->name_space)._M_str;
    __y_00._M_len = (right->name_space)._M_len;
    __y_00._M_str = (right->name_space)._M_str;
    bVar1 = std::operator==(__x_00,__y_00);
    return bVar1;
  }
  return false;
}

Assistant:

bool operator==(type_name const& left, type_name const& right)
    {
        return left.name == right.name && left.name_space == right.name_space;
    }